

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersTest::DrawAndCheck(VertexBuffersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  MessageBuilder local_1b8;
  int local_34;
  int local_30;
  GLint i;
  GLint result [2];
  GLint *result_ptr;
  Functions *gl;
  VertexBuffersTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(this->m_po);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x677);
  (**(code **)(lVar4 + 0xd8))(this->m_vao);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x67a);
  (**(code **)(lVar4 + 0x30))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x67d);
  (**(code **)(lVar4 + 0x538))(0,0,2);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x681);
  (**(code **)(lVar4 + 0x638))();
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x685);
  result = (GLint  [2])(**(code **)(lVar4 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x689);
  local_30 = *(int *)result;
  i = *(GLint *)((long)result + 4);
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x68e);
  local_34 = 0;
  while( true ) {
    if (1 < local_34) {
      return true;
    }
    if (DrawAndCheck::reference[local_34] != (&local_30)[local_34]) break;
    local_34 = local_34 + 1;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [28])"Result vector is equal to [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_30);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&i);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"], but [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,DrawAndCheck::reference);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,DrawAndCheck::reference + 1);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x2a70901);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  return false;
}

Assistant:

bool VertexBuffersTest::DrawAndCheck()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/* Draw. */
	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* State reset. */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	glw::GLint* result_ptr = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	glw::GLint result[2] = { result_ptr[0], result_ptr[1] };

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	static const glw::GLint reference[2] = { 0 + 2 + 4, 1 + 3 + 5 };

	/* Check result and return. */
	for (glw::GLint i = 0; i < 2; ++i)
	{
		if (reference[i] != result[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to [" << result[0]
												<< ", " << result[1] << "], but [" << reference[0] << ", "
												<< reference[1] << "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}